

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O0

void __thiscall subprocess::Popen::init_args<subprocess::error>(Popen *this,error *farg)

{
  long in_FS_OFFSET;
  ArgumentDeducer argd;
  Popen *in_stack_ffffffffffffffc8;
  error *in_stack_fffffffffffffff0;
  ArgumentDeducer *this_00;
  
  this_00 = *(ArgumentDeducer **)(in_FS_OFFSET + 0x28);
  detail::ArgumentDeducer::ArgumentDeducer
            ((ArgumentDeducer *)in_stack_ffffffffffffffc8,(Popen *)0x192f7f9);
  detail::ArgumentDeducer::set_option(this_00,in_stack_fffffffffffffff0);
  init_args(in_stack_ffffffffffffffc8);
  if (*(ArgumentDeducer **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void Popen::init_args(F&& farg, Args&&... args)
{
  detail::ArgumentDeducer argd(this);
  argd.set_option(std::forward<F>(farg));
  init_args(std::forward<Args>(args)...);
}